

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

Production * new_internal_production(Grammar *g,Production *p)

{
  byte bVar1;
  uint uVar2;
  Production **ppPVar3;
  bool bVar4;
  size_t sVar5;
  char *__s;
  Production *pPVar6;
  uint uVar7;
  Production *pPVar8;
  Production *pPVar9;
  char *__s_00;
  
  if (p == (Production *)0x0) {
    __s_00 = " _synthetic";
  }
  else {
    __s_00 = p->name;
  }
  sVar5 = strlen(__s_00);
  __s = (char *)malloc((long)((sVar5 << 0x20) + 0x1500000000) >> 0x20);
  if (__s == (char *)0x0) {
    pPVar6 = (Production *)0x0;
    d_fail("could not allocate enough memory for a new_internal_production");
  }
  else {
    uVar7 = 0;
    snprintf(__s,(long)((sVar5 << 0x20) + 0x1400000000) >> 0x20,"%s__%d",__s_00,
             (ulong)(g->productions).n);
    pPVar6 = new_production(g,__s);
    bVar1 = pPVar6->field_0x3c;
    pPVar6->field_0x3c = bVar1 & 0xe3 | 4;
    if (p == (Production *)0x0) {
      pPVar6->field_0x3c = bVar1 & 0xe2 | 4;
    }
    else {
      pPVar6->field_0x3c = bVar1 & 0xe2 | 4 | p->field_0x3c & 1;
      uVar2 = (g->productions).n;
      pPVar8 = (Production *)0x0;
      bVar4 = false;
      for (; uVar7 < uVar2; uVar7 = uVar7 + 1) {
        ppPVar3 = (g->productions).v;
        pPVar9 = ppPVar3[uVar7];
        if (bVar4) {
          ppPVar3[uVar7] = pPVar8;
LAB_0013a67b:
          bVar4 = true;
          pPVar8 = pPVar9;
        }
        else {
          bVar4 = false;
          if (pPVar9 == p) {
            pPVar9 = ppPVar3[(ulong)uVar7 + 1];
            ppPVar3[(ulong)uVar7 + 1] = pPVar6;
            uVar7 = uVar7 + 1;
            goto LAB_0013a67b;
          }
        }
      }
    }
  }
  return pPVar6;
}

Assistant:

Production *new_internal_production(Grammar *g, Production *p) {
  char *n = p ? p->name : " _synthetic";
  int maxLen = strlen(n) + 21;
  char *name = MALLOC(maxLen);
  if (name == NULL) {
    d_fail("could not allocate enough memory for a new_internal_production");
    return NULL;
  }
  maxLen--;
  Production *pp = NULL, *tp = NULL, *ttp;
  uint i, found = 0;
  snprintf(name, maxLen, "%s__%d", n, g->productions.n);
  pp = new_production(g, name);
  pp->internal = INTERNAL_HIDDEN;
  pp->regex = p ? p->regex : 0;
  if (p) {
    for (i = 0; i < g->productions.n; i++) {
      if (found) {
        ttp = g->productions.v[i];
        g->productions.v[i] = tp;
        tp = ttp;
      } else if (p == g->productions.v[i]) {
        found = 1;
        tp = g->productions.v[i + 1];
        g->productions.v[i + 1] = pp;
        i++;
      }
    }
  }
  return pp;
}